

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

wchar_t * fmt::v5::internal::
          parse_align<wchar_t,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
                    *handler)

{
  char cVar1;
  bool bVar2;
  alignment align;
  ulong uVar3;
  wchar_t *pwVar4;
  
  pwVar4 = begin + 1;
  uVar3 = (ulong)(pwVar4 != end);
  do {
    cVar1 = (char)begin[uVar3];
    if (cVar1 == '<') {
      align = ALIGN_LEFT;
LAB_001698fb:
      if ((int)uVar3 != 0) {
        if (*begin == L'{') {
          specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ::on_error(&handler->
                      super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                     ,"invalid fill character \'{\'");
          return begin;
        }
        pwVar4 = begin + 2;
        (((handler->
          super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
          ).super_specs_setter<wchar_t>.specs_)->super_align_spec).fill_ = *begin;
      }
      specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_>
      ::on_align(handler,align);
      return pwVar4;
    }
    if (cVar1 == '^') {
      align = ALIGN_CENTER;
      goto LAB_001698fb;
    }
    if (cVar1 == '>') {
      align = ALIGN_RIGHT;
      goto LAB_001698fb;
    }
    if (cVar1 == '=') {
      align = ALIGN_NUMERIC;
      goto LAB_001698fb;
    }
    bVar2 = (long)uVar3 < 1;
    uVar3 = uVar3 - 1;
    if (bVar2) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR const Char *parse_align(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  alignment align = ALIGN_DEFAULT;
  int i = 0;
  if (begin + 1 != end) ++i;
  do {
    switch (static_cast<char>(begin[i])) {
    case '<':
      align = ALIGN_LEFT;
      break;
    case '>':
      align = ALIGN_RIGHT;
      break;
    case '=':
      align = ALIGN_NUMERIC;
      break;
    case '^':
      align = ALIGN_CENTER;
      break;
    }
    if (align != ALIGN_DEFAULT) {
      if (i > 0) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        begin += 2;
        handler.on_fill(c);
      } else ++begin;
      handler.on_align(align);
      break;
    }
  } while (i-- > 0);
  return begin;
}